

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
          (SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
           *this,Candidate *arg_list_begin,Candidate *arg_list_end)

{
  ulong count_00;
  ulong local_30;
  size_t i;
  size_t count;
  Candidate *arg_list_end_local;
  Candidate *arg_list_begin_local;
  SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL> *this_local;
  
  SmallVector(this);
  count_00 = (long)arg_list_end - (long)arg_list_begin >> 2;
  reserve(this,count_00);
  arg_list_end_local = arg_list_begin;
  for (local_30 = 0; local_30 < count_00; local_30 = local_30 + 1) {
    (this->super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr
    [local_30] = *arg_list_end_local;
    arg_list_end_local = arg_list_end_local + 1;
  }
  (this->super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).
  buffer_size = count_00;
  return;
}

Assistant:

SmallVector(const U *arg_list_begin, const U *arg_list_end) SPIRV_CROSS_NOEXCEPT : SmallVector()
	{
		auto count = size_t(arg_list_end - arg_list_begin);
		reserve(count);
		for (size_t i = 0; i < count; i++, arg_list_begin++)
			new (&this->ptr[i]) T(*arg_list_begin);
		this->buffer_size = count;
	}